

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paex_record.c
# Opt level: O1

int playCallback(void *inputBuffer,void *outputBuffer,unsigned_long framesPerBuffer,
                PaStreamCallbackTimeInfo *timeInfo,PaStreamCallbackFlags statusFlags,void *userData)

{
  int iVar1;
  long lVar2;
  uint uVar3;
  ulong uVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  
  iVar1 = *userData;
  lVar2 = (long)(iVar1 * 2) * 4 + *(long *)((long)userData + 8);
  iVar5 = *(int *)((long)userData + 4);
  uVar4 = (ulong)(uint)(iVar5 - iVar1);
  if (uVar4 < framesPerBuffer) {
    if (iVar5 == iVar1) {
      uVar4 = 0;
    }
    else {
      lVar6 = 0;
      lVar7 = 0;
      do {
        *(undefined4 *)((long)outputBuffer + lVar7 * 8) = *(undefined4 *)(lVar2 + lVar7 * 8);
        *(undefined4 *)((long)outputBuffer + lVar7 * 8 + 4) = *(undefined4 *)(lVar2 + 4 + lVar7 * 8)
        ;
        lVar7 = lVar7 + 1;
        lVar6 = lVar6 + -8;
      } while (iVar5 - iVar1 != (uint)lVar7);
      outputBuffer = (void *)((long)outputBuffer - lVar6);
    }
    uVar3 = (uint)uVar4;
    iVar1 = 1;
    while (uVar4 < framesPerBuffer) {
      uVar3 = uVar3 + 1;
      *(undefined8 *)outputBuffer = 0;
      outputBuffer = (void *)((long)outputBuffer + 8);
      uVar4 = (ulong)uVar3;
    }
  }
  else {
    if (framesPerBuffer != 0) {
      lVar6 = 0;
      do {
        *(undefined4 *)((long)outputBuffer + lVar6 * 8) = *(undefined4 *)(lVar2 + lVar6 * 8);
        *(undefined4 *)((long)outputBuffer + lVar6 * 8 + 4) = *(undefined4 *)(lVar2 + 4 + lVar6 * 8)
        ;
        lVar6 = lVar6 + 1;
      } while ((uint)lVar6 < (uint)framesPerBuffer);
    }
    iVar5 = iVar1 + (uint)framesPerBuffer;
    iVar1 = 0;
  }
  *(int *)userData = iVar5;
  return iVar1;
}

Assistant:

static int playCallback( const void *inputBuffer, void *outputBuffer,
                         unsigned long framesPerBuffer,
                         const PaStreamCallbackTimeInfo* timeInfo,
                         PaStreamCallbackFlags statusFlags,
                         void *userData )
{
    paTestData *data = (paTestData*)userData;
    SAMPLE *rptr = &data->recordedSamples[data->frameIndex * NUM_CHANNELS];
    SAMPLE *wptr = (SAMPLE*)outputBuffer;
    unsigned int i;
    int finished;
    unsigned int framesLeft = data->maxFrameIndex - data->frameIndex;

    (void) inputBuffer; /* Prevent unused variable warnings. */
    (void) timeInfo;
    (void) statusFlags;
    (void) userData;

    if( framesLeft < framesPerBuffer )
    {
        /* final buffer... */
        for( i=0; i<framesLeft; i++ )
        {
            *wptr++ = *rptr++;  /* left */
            if( NUM_CHANNELS == 2 ) *wptr++ = *rptr++;  /* right */
        }
        for( ; i<framesPerBuffer; i++ )
        {
            *wptr++ = 0;  /* left */
            if( NUM_CHANNELS == 2 ) *wptr++ = 0;  /* right */
        }
        data->frameIndex += framesLeft;
        finished = paComplete;
    }
    else
    {
        for( i=0; i<framesPerBuffer; i++ )
        {
            *wptr++ = *rptr++;  /* left */
            if( NUM_CHANNELS == 2 ) *wptr++ = *rptr++;  /* right */
        }
        data->frameIndex += framesPerBuffer;
        finished = paContinue;
    }
    return finished;
}